

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O0

FName __thiscall FSkillInfo::GetReplacement(FSkillInfo *this,FName *a)

{
  FName *pFVar1;
  FName *in_RDX;
  FName local_28;
  FName local_24 [3];
  FName *a_local;
  FSkillInfo *this_local;
  
  a_local = a;
  this_local = this;
  FName::FName(local_24,in_RDX);
  pFVar1 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::CheckKey
                     ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(a + 0x28),
                      local_24);
  if (pFVar1 == (FName *)0x0) {
    FName::FName(&this->Name,NAME_None);
  }
  else {
    FName::FName(&local_28,in_RDX);
    pFVar1 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator[]
                       ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(a + 0x28),
                        &local_28);
    FName::FName(&this->Name,pFVar1);
  }
  return (FName)(int)this;
}

Assistant:

FName FSkillInfo::GetReplacement(FName a)
{
	if (Replace.CheckKey(a)) return Replace[a];
	else return NAME_None;
}